

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string.hpp
# Opt level: O1

p_rank * __thiscall
dna_string::parallel_rank(p_rank *__return_storage_ptr__,dna_string *this,uint64_t i)

{
  pointer ppVar1;
  uint64_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  pointer ppVar5;
  uint8_t *puVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  char cVar28;
  ushort uVar29;
  byte bVar48;
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  char cVar49;
  byte bVar50;
  char cVar51;
  byte bVar52;
  char cVar53;
  byte bVar54;
  char cVar55;
  byte bVar56;
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar46 [16];
  char cVar57;
  ushort uVar58;
  byte bVar69;
  char cVar70;
  byte bVar71;
  char cVar72;
  byte bVar73;
  char cVar74;
  byte bVar75;
  char cVar76;
  byte bVar77;
  undefined1 auVar67 [16];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar83 [16];
  undefined1 auVar85 [12];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar86 [12];
  undefined1 auVar93 [16];
  undefined1 auVar94 [12];
  undefined1 auVar99 [16];
  undefined1 auVar95 [12];
  undefined1 auVar101 [16];
  undefined4 uVar30;
  undefined6 uVar31;
  undefined8 uVar32;
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar37 [14];
  undefined1 auVar38 [14];
  undefined1 auVar39 [14];
  undefined1 auVar40 [14];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined4 uVar59;
  undefined6 uVar60;
  undefined8 uVar61;
  undefined1 auVar62 [12];
  undefined1 auVar63 [12];
  undefined1 auVar64 [14];
  undefined1 auVar65 [14];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar80 [14];
  undefined1 auVar81 [14];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [14];
  undefined1 auVar88 [14];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar96 [14];
  undefined1 auVar97 [14];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  
  uVar15 = i >> 0x20;
  uVar10 = (uint)i & 0x7f;
  ppVar5 = (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = this->data;
  uVar11 = (ulong)((uint)i >> 1 & 0xffffffc0);
  ppVar1 = ppVar5 + uVar15;
  uVar7 = ppVar1->C;
  puVar2 = &ppVar5[uVar15].G;
  uVar8 = *puVar2;
  uVar9 = puVar2[1];
  uVar3 = *(ulong *)(puVar6 + uVar11 + 0x30 + uVar15 * 0x80000000);
  uVar4 = *(ulong *)(puVar6 + uVar11 + 0x38 + uVar15 * 0x80000000);
  bVar48 = (byte)uVar10;
  if (uVar10 < 0x40) {
    uVar12 = ~(0xffffffffffffffffU >> (bVar48 & 0x3f) |
              *(ulong *)(puVar6 + uVar11 + uVar15 * 0x80000000 + 0x28));
    uVar14 = ~*(ulong *)(puVar6 + uVar11 + uVar15 * 0x80000000 + 0x18) & uVar12;
    uVar12 = uVar12 & *(ulong *)(puVar6 + uVar11 + uVar15 * 0x80000000 + 0x18);
    auVar41._8_4_ = (int)uVar14;
    auVar41._0_8_ = uVar14;
    auVar41._12_4_ = (int)(uVar14 >> 0x20);
    auVar23._8_8_ = *(ulong *)(puVar6 + uVar11 + uVar15 * 0x80000000 + 8);
    auVar23._0_8_ = ~*(ulong *)(puVar6 + uVar11 + uVar15 * 0x80000000 + 8);
    auVar41 = auVar41 & auVar23;
    auVar19._0_2_ = auVar41._0_2_ >> 1;
    auVar19._2_2_ = auVar41._2_2_ >> 1;
    auVar19._4_2_ = auVar41._4_2_ >> 1;
    auVar19._6_2_ = auVar41._6_2_ >> 1;
    auVar19._8_2_ = auVar41._8_2_ >> 1;
    auVar19._10_2_ = auVar41._10_2_ >> 1;
    auVar19._12_2_ = auVar41._12_2_ >> 1;
    auVar19._14_2_ = auVar41._14_2_ >> 1;
    auVar19 = auVar19 & _DAT_001150b0;
    uVar29 = CONCAT11(auVar41[1] - auVar19[1],auVar41[0] - auVar19[0]);
    uVar30 = CONCAT13(auVar41[3] - auVar19[3],CONCAT12(auVar41[2] - auVar19[2],uVar29));
    uVar31 = CONCAT15(auVar41[5] - auVar19[5],CONCAT14(auVar41[4] - auVar19[4],uVar30));
    uVar32 = CONCAT17(auVar41[7] - auVar19[7],CONCAT16(auVar41[6] - auVar19[6],uVar31));
    auVar33._0_10_ = CONCAT19(auVar41[9] - auVar19[9],CONCAT18(auVar41[8] - auVar19[8],uVar32));
    auVar33[10] = auVar41[10] - auVar19[10];
    auVar33[0xb] = auVar41[0xb] - auVar19[0xb];
    auVar37[0xc] = auVar41[0xc] - auVar19[0xc];
    auVar37._0_12_ = auVar33;
    auVar37[0xd] = auVar41[0xd] - auVar19[0xd];
    auVar42[0xe] = auVar41[0xe] - auVar19[0xe];
    auVar42._0_14_ = auVar37;
    auVar42[0xf] = auVar41[0xf] - auVar19[0xf];
    auVar20 = auVar42 & _DAT_001150c0;
    auVar43._0_2_ = uVar29 >> 2;
    auVar43._2_2_ = (ushort)((uint)uVar30 >> 0x12);
    auVar43._4_2_ = (ushort)((uint6)uVar31 >> 0x22);
    auVar43._6_2_ = (ushort)((ulong)uVar32 >> 0x32);
    auVar43._8_2_ = (ushort)((unkuint10)auVar33._0_10_ >> 0x42);
    auVar43._10_2_ = auVar33._10_2_ >> 2;
    auVar43._12_2_ = auVar37._12_2_ >> 2;
    auVar43._14_2_ = auVar42._14_2_ >> 2;
    auVar43 = auVar43 & _DAT_001150c0;
    cVar28 = auVar43[0] + auVar20[0];
    bVar48 = auVar43[1] + auVar20[1];
    uVar29 = CONCAT11(bVar48,cVar28);
    cVar49 = auVar43[2] + auVar20[2];
    bVar50 = auVar43[3] + auVar20[3];
    uVar30 = CONCAT13(bVar50,CONCAT12(cVar49,uVar29));
    cVar51 = auVar43[4] + auVar20[4];
    bVar52 = auVar43[5] + auVar20[5];
    uVar31 = CONCAT15(bVar52,CONCAT14(cVar51,uVar30));
    cVar53 = auVar43[6] + auVar20[6];
    bVar54 = auVar43[7] + auVar20[7];
    uVar32 = CONCAT17(bVar54,CONCAT16(cVar53,uVar31));
    cVar55 = auVar43[8] + auVar20[8];
    bVar56 = auVar43[9] + auVar20[9];
    auVar34._0_10_ = CONCAT19(bVar56,CONCAT18(cVar55,uVar32));
    auVar34[10] = auVar43[10] + auVar20[10];
    auVar34[0xb] = auVar43[0xb] + auVar20[0xb];
    auVar38[0xc] = auVar43[0xc] + auVar20[0xc];
    auVar38._0_12_ = auVar34;
    auVar38[0xd] = auVar43[0xd] + auVar20[0xd];
    auVar44[0xe] = auVar43[0xe] + auVar20[0xe];
    auVar44._0_14_ = auVar38;
    auVar44[0xf] = auVar43[0xf] + auVar20[0xf];
    auVar21[0] = (char)(uVar29 >> 4) + cVar28;
    auVar21[1] = (bVar48 >> 4) + bVar48;
    auVar21[2] = (char)(ushort)((uint)uVar30 >> 0x14) + cVar49;
    auVar21[3] = (bVar50 >> 4) + bVar50;
    auVar21[4] = (char)(ushort)((uint6)uVar31 >> 0x24) + cVar51;
    auVar21[5] = (bVar52 >> 4) + bVar52;
    auVar21[6] = (char)(ushort)((ulong)uVar32 >> 0x34) + cVar53;
    auVar21[7] = (bVar54 >> 4) + bVar54;
    auVar21[8] = (char)(ushort)((unkuint10)auVar34._0_10_ >> 0x44) + cVar55;
    auVar21[9] = (bVar56 >> 4) + bVar56;
    auVar21[10] = (char)(auVar34._10_2_ >> 4) + auVar34[10];
    auVar21[0xb] = (auVar34[0xb] >> 4) + auVar34[0xb];
    auVar21[0xc] = (char)(auVar38._12_2_ >> 4) + auVar38[0xc];
    auVar21[0xd] = (auVar38[0xd] >> 4) + auVar38[0xd];
    auVar21[0xe] = (char)(auVar44._14_2_ >> 4) + auVar44[0xe];
    auVar21[0xf] = (auVar44[0xf] >> 4) + auVar44[0xf];
    auVar20 = psadbw(auVar21 & _DAT_001150d0,(undefined1  [16])0x0);
    auVar89._8_4_ = (int)uVar12;
    auVar89._0_8_ = uVar12;
    auVar89._12_4_ = (int)(uVar12 >> 0x20);
    auVar89 = auVar89 & auVar23;
    auVar24._0_2_ = auVar89._0_2_ >> 1;
    auVar24._2_2_ = auVar89._2_2_ >> 1;
    auVar24._4_2_ = auVar89._4_2_ >> 1;
    auVar24._6_2_ = auVar89._6_2_ >> 1;
    auVar24._8_2_ = auVar89._8_2_ >> 1;
    auVar24._10_2_ = auVar89._10_2_ >> 1;
    auVar24._12_2_ = auVar89._12_2_ >> 1;
    auVar24._14_2_ = auVar89._14_2_ >> 1;
    auVar24 = auVar24 & _DAT_001150b0;
    uVar29 = CONCAT11(auVar89[1] - auVar24[1],auVar89[0] - auVar24[0]);
    uVar30 = CONCAT13(auVar89[3] - auVar24[3],CONCAT12(auVar89[2] - auVar24[2],uVar29));
    uVar31 = CONCAT15(auVar89[5] - auVar24[5],CONCAT14(auVar89[4] - auVar24[4],uVar30));
    uVar32 = CONCAT17(auVar89[7] - auVar24[7],CONCAT16(auVar89[6] - auVar24[6],uVar31));
    auVar85._0_10_ = CONCAT19(auVar89[9] - auVar24[9],CONCAT18(auVar89[8] - auVar24[8],uVar32));
    auVar85[10] = auVar89[10] - auVar24[10];
    auVar85[0xb] = auVar89[0xb] - auVar24[0xb];
    auVar87[0xc] = auVar89[0xc] - auVar24[0xc];
    auVar87._0_12_ = auVar85;
    auVar87[0xd] = auVar89[0xd] - auVar24[0xd];
    auVar90[0xe] = auVar89[0xe] - auVar24[0xe];
    auVar90._0_14_ = auVar87;
    auVar90[0xf] = auVar89[0xf] - auVar24[0xf];
    auVar25 = auVar90 & _DAT_001150c0;
    auVar91._0_2_ = uVar29 >> 2;
    auVar91._2_2_ = (ushort)((uint)uVar30 >> 0x12);
    auVar91._4_2_ = (ushort)((uint6)uVar31 >> 0x22);
    auVar91._6_2_ = (ushort)((ulong)uVar32 >> 0x32);
    auVar91._8_2_ = (ushort)((unkuint10)auVar85._0_10_ >> 0x42);
    auVar91._10_2_ = auVar85._10_2_ >> 2;
    auVar91._12_2_ = auVar87._12_2_ >> 2;
    auVar91._14_2_ = auVar90._14_2_ >> 2;
    auVar91 = auVar91 & _DAT_001150c0;
    cVar28 = auVar91[0] + auVar25[0];
    bVar48 = auVar91[1] + auVar25[1];
    uVar29 = CONCAT11(bVar48,cVar28);
    cVar49 = auVar91[2] + auVar25[2];
    bVar50 = auVar91[3] + auVar25[3];
    uVar30 = CONCAT13(bVar50,CONCAT12(cVar49,uVar29));
    cVar51 = auVar91[4] + auVar25[4];
    bVar52 = auVar91[5] + auVar25[5];
    uVar31 = CONCAT15(bVar52,CONCAT14(cVar51,uVar30));
    cVar53 = auVar91[6] + auVar25[6];
    bVar54 = auVar91[7] + auVar25[7];
    uVar32 = CONCAT17(bVar54,CONCAT16(cVar53,uVar31));
    cVar55 = auVar91[8] + auVar25[8];
    bVar56 = auVar91[9] + auVar25[9];
    auVar86._0_10_ = CONCAT19(bVar56,CONCAT18(cVar55,uVar32));
    auVar86[10] = auVar91[10] + auVar25[10];
    auVar86[0xb] = auVar91[0xb] + auVar25[0xb];
    auVar88[0xc] = auVar91[0xc] + auVar25[0xc];
    auVar88._0_12_ = auVar86;
    auVar88[0xd] = auVar91[0xd] + auVar25[0xd];
    auVar92[0xe] = auVar91[0xe] + auVar25[0xe];
    auVar92._0_14_ = auVar88;
    auVar92[0xf] = auVar91[0xf] + auVar25[0xf];
    auVar26[0] = (char)(uVar29 >> 4) + cVar28;
    auVar26[1] = (bVar48 >> 4) + bVar48;
    auVar26[2] = (char)(ushort)((uint)uVar30 >> 0x14) + cVar49;
    auVar26[3] = (bVar50 >> 4) + bVar50;
    auVar26[4] = (char)(ushort)((uint6)uVar31 >> 0x24) + cVar51;
    auVar26[5] = (bVar52 >> 4) + bVar52;
    auVar26[6] = (char)(ushort)((ulong)uVar32 >> 0x34) + cVar53;
    auVar26[7] = (bVar54 >> 4) + bVar54;
    auVar26[8] = (char)(ushort)((unkuint10)auVar86._0_10_ >> 0x44) + cVar55;
    auVar26[9] = (bVar56 >> 4) + bVar56;
    auVar26[10] = (char)(auVar86._10_2_ >> 4) + auVar86[10];
    auVar26[0xb] = (auVar86[0xb] >> 4) + auVar86[0xb];
    auVar26[0xc] = (char)(auVar88._12_2_ >> 4) + auVar88[0xc];
    auVar26[0xd] = (auVar88[0xd] >> 4) + auVar88[0xd];
    auVar26[0xe] = (char)(auVar92._14_2_ >> 4) + auVar92[0xe];
    auVar26[0xf] = (auVar92[0xf] >> 4) + auVar92[0xf];
    auVar25 = psadbw(auVar26 & _DAT_001150d0,(undefined1  [16])0x0);
  }
  else {
    uVar13 = 0xffffffffffffffff >> (bVar48 & 0x3f);
    uVar14 = uVar13;
    uVar12 = 0;
    if ((i & 0x40) == 0) {
      uVar14 = 0xffffffffffffffff;
      uVar12 = uVar13;
    }
    uVar17 = ~*(ulong *)(puVar6 + uVar11 + uVar15 * 0x80000000 + 0x10) &
             ~(uVar14 | *(ulong *)(puVar6 + uVar11 + uVar15 * 0x80000000 + 0x20));
    uVar16 = ~*(ulong *)(puVar6 + uVar11 + uVar15 * 0x80000000 + 0x18) &
             ~(uVar12 | *(ulong *)(puVar6 + uVar11 + uVar15 * 0x80000000 + 0x28));
    uVar14 = ~(uVar14 | *(ulong *)(puVar6 + uVar11 + uVar15 * 0x80000000 + 0x20)) &
             *(ulong *)(puVar6 + uVar11 + uVar15 * 0x80000000 + 0x10);
    uVar13 = ~(uVar12 | *(ulong *)(puVar6 + uVar11 + uVar15 * 0x80000000 + 0x28)) &
             *(ulong *)(puVar6 + uVar11 + uVar15 * 0x80000000 + 0x18);
    uVar12 = *(ulong *)(puVar6 + uVar11 + uVar15 * 0x80000000);
    uVar11 = *(ulong *)(puVar6 + uVar11 + uVar15 * 0x80000000 + 8);
    uVar15 = uVar16 & ~uVar11;
    uVar16 = uVar16 & uVar11;
    uVar18 = uVar17 & ~uVar12;
    uVar17 = uVar17 & uVar12;
    auVar20._0_2_ = (ushort)uVar15 >> 1;
    auVar20._2_2_ = (ushort)(uVar15 >> 0x10) >> 1;
    auVar20._4_2_ = (ushort)(uVar15 >> 0x20) >> 1;
    auVar20._6_2_ = (ushort)(uVar15 >> 0x31);
    auVar20._8_2_ = (ushort)uVar16 >> 1;
    auVar20._10_2_ = (ushort)(uVar16 >> 0x10) >> 1;
    auVar20._12_2_ = (ushort)(uVar16 >> 0x20) >> 1;
    auVar20._14_2_ = (ushort)(uVar16 >> 0x31);
    auVar20 = auVar20 & _DAT_001150b0;
    uVar29 = CONCAT11((char)(uVar15 >> 8) - auVar20[1],(char)uVar15 - auVar20[0]);
    uVar30 = CONCAT13((char)(uVar15 >> 0x18) - auVar20[3],
                      CONCAT12((char)(uVar15 >> 0x10) - auVar20[2],uVar29));
    uVar31 = CONCAT15((char)(uVar15 >> 0x28) - auVar20[5],
                      CONCAT14((char)(uVar15 >> 0x20) - auVar20[4],uVar30));
    uVar32 = CONCAT17((char)(uVar15 >> 0x38) - auVar20[7],
                      CONCAT16((char)(uVar15 >> 0x30) - auVar20[6],uVar31));
    auVar35._0_10_ =
         CONCAT19((char)(uVar16 >> 8) - auVar20[9],CONCAT18((char)uVar16 - auVar20[8],uVar32));
    auVar35[10] = (char)(uVar16 >> 0x10) - auVar20[10];
    auVar35[0xb] = (char)(uVar16 >> 0x18) - auVar20[0xb];
    auVar39[0xc] = (char)(uVar16 >> 0x20) - auVar20[0xc];
    auVar39._0_12_ = auVar35;
    auVar39[0xd] = (char)(uVar16 >> 0x28) - auVar20[0xd];
    auVar45[0xe] = (char)(uVar16 >> 0x30) - auVar20[0xe];
    auVar45._0_14_ = auVar39;
    auVar45[0xf] = (char)(uVar16 >> 0x38) - auVar20[0xf];
    auVar20 = auVar45 & _DAT_001150c0;
    auVar46._0_2_ = uVar29 >> 2;
    auVar46._2_2_ = (ushort)((uint)uVar30 >> 0x12);
    auVar46._4_2_ = (ushort)((uint6)uVar31 >> 0x22);
    auVar46._6_2_ = (ushort)((ulong)uVar32 >> 0x32);
    auVar46._8_2_ = (ushort)((unkuint10)auVar35._0_10_ >> 0x42);
    auVar46._10_2_ = auVar35._10_2_ >> 2;
    auVar46._12_2_ = auVar39._12_2_ >> 2;
    auVar46._14_2_ = auVar45._14_2_ >> 2;
    auVar46 = auVar46 & _DAT_001150c0;
    cVar28 = auVar46[0] + auVar20[0];
    bVar48 = auVar46[1] + auVar20[1];
    uVar29 = CONCAT11(bVar48,cVar28);
    cVar49 = auVar46[2] + auVar20[2];
    bVar50 = auVar46[3] + auVar20[3];
    uVar30 = CONCAT13(bVar50,CONCAT12(cVar49,uVar29));
    cVar51 = auVar46[4] + auVar20[4];
    bVar52 = auVar46[5] + auVar20[5];
    uVar31 = CONCAT15(bVar52,CONCAT14(cVar51,uVar30));
    cVar53 = auVar46[6] + auVar20[6];
    bVar54 = auVar46[7] + auVar20[7];
    uVar32 = CONCAT17(bVar54,CONCAT16(cVar53,uVar31));
    cVar55 = auVar46[8] + auVar20[8];
    bVar56 = auVar46[9] + auVar20[9];
    auVar36._0_10_ = CONCAT19(bVar56,CONCAT18(cVar55,uVar32));
    auVar36[10] = auVar46[10] + auVar20[10];
    auVar36[0xb] = auVar46[0xb] + auVar20[0xb];
    auVar40[0xc] = auVar46[0xc] + auVar20[0xc];
    auVar40._0_12_ = auVar36;
    auVar40[0xd] = auVar46[0xd] + auVar20[0xd];
    auVar47[0xe] = auVar46[0xe] + auVar20[0xe];
    auVar47._0_14_ = auVar40;
    auVar47[0xf] = auVar46[0xf] + auVar20[0xf];
    auVar25._0_2_ = (ushort)uVar18 >> 1;
    auVar25._2_2_ = (ushort)(uVar18 >> 0x10) >> 1;
    auVar25._4_2_ = (ushort)(uVar18 >> 0x20) >> 1;
    auVar25._6_2_ = (ushort)(uVar18 >> 0x31);
    auVar25._8_2_ = (ushort)uVar17 >> 1;
    auVar25._10_2_ = (ushort)(uVar17 >> 0x10) >> 1;
    auVar25._12_2_ = (ushort)(uVar17 >> 0x20) >> 1;
    auVar25._14_2_ = (ushort)(uVar17 >> 0x31);
    auVar25 = auVar25 & _DAT_001150b0;
    uVar58 = CONCAT11((char)(uVar18 >> 8) - auVar25[1],(char)uVar18 - auVar25[0]);
    uVar59 = CONCAT13((char)(uVar18 >> 0x18) - auVar25[3],
                      CONCAT12((char)(uVar18 >> 0x10) - auVar25[2],uVar58));
    uVar60 = CONCAT15((char)(uVar18 >> 0x28) - auVar25[5],
                      CONCAT14((char)(uVar18 >> 0x20) - auVar25[4],uVar59));
    uVar61 = CONCAT17((char)(uVar18 >> 0x38) - auVar25[7],
                      CONCAT16((char)(uVar18 >> 0x30) - auVar25[6],uVar60));
    auVar62._0_10_ =
         CONCAT19((char)(uVar17 >> 8) - auVar25[9],CONCAT18((char)uVar17 - auVar25[8],uVar61));
    auVar62[10] = (char)(uVar17 >> 0x10) - auVar25[10];
    auVar62[0xb] = (char)(uVar17 >> 0x18) - auVar25[0xb];
    auVar64[0xc] = (char)(uVar17 >> 0x20) - auVar25[0xc];
    auVar64._0_12_ = auVar62;
    auVar64[0xd] = (char)(uVar17 >> 0x28) - auVar25[0xd];
    auVar66[0xe] = (char)(uVar17 >> 0x30) - auVar25[0xe];
    auVar66._0_14_ = auVar64;
    auVar66[0xf] = (char)(uVar17 >> 0x38) - auVar25[0xf];
    auVar20 = auVar66 & _DAT_001150c0;
    auVar67._0_2_ = uVar58 >> 2;
    auVar67._2_2_ = (ushort)((uint)uVar59 >> 0x12);
    auVar67._4_2_ = (ushort)((uint6)uVar60 >> 0x22);
    auVar67._6_2_ = (ushort)((ulong)uVar61 >> 0x32);
    auVar67._8_2_ = (ushort)((unkuint10)auVar62._0_10_ >> 0x42);
    auVar67._10_2_ = auVar62._10_2_ >> 2;
    auVar67._12_2_ = auVar64._12_2_ >> 2;
    auVar67._14_2_ = auVar66._14_2_ >> 2;
    auVar67 = auVar67 & _DAT_001150c0;
    cVar57 = auVar67[0] + auVar20[0];
    bVar69 = auVar67[1] + auVar20[1];
    uVar58 = CONCAT11(bVar69,cVar57);
    cVar70 = auVar67[2] + auVar20[2];
    bVar71 = auVar67[3] + auVar20[3];
    uVar59 = CONCAT13(bVar71,CONCAT12(cVar70,uVar58));
    cVar72 = auVar67[4] + auVar20[4];
    bVar73 = auVar67[5] + auVar20[5];
    uVar60 = CONCAT15(bVar73,CONCAT14(cVar72,uVar59));
    cVar74 = auVar67[6] + auVar20[6];
    bVar75 = auVar67[7] + auVar20[7];
    uVar61 = CONCAT17(bVar75,CONCAT16(cVar74,uVar60));
    cVar76 = auVar67[8] + auVar20[8];
    bVar77 = auVar67[9] + auVar20[9];
    auVar63._0_10_ = CONCAT19(bVar77,CONCAT18(cVar76,uVar61));
    auVar63[10] = auVar67[10] + auVar20[10];
    auVar63[0xb] = auVar67[0xb] + auVar20[0xb];
    auVar65[0xc] = auVar67[0xc] + auVar20[0xc];
    auVar65._0_12_ = auVar63;
    auVar65[0xd] = auVar67[0xd] + auVar20[0xd];
    auVar68[0xe] = auVar67[0xe] + auVar20[0xe];
    auVar68._0_14_ = auVar65;
    auVar68[0xf] = auVar67[0xf] + auVar20[0xf];
    auVar22[0] = ((char)(uVar58 >> 4) + cVar57 & 0xfU) + ((char)(uVar29 >> 4) + cVar28 & 0xfU);
    auVar22[1] = ((bVar69 >> 4) + bVar69 & 0xf) + ((bVar48 >> 4) + bVar48 & 0xf);
    auVar22[2] = ((char)(ushort)((uint)uVar59 >> 0x14) + cVar70 & 0xfU) +
                 ((char)(ushort)((uint)uVar30 >> 0x14) + cVar49 & 0xfU);
    auVar22[3] = ((bVar71 >> 4) + bVar71 & 0xf) + ((bVar50 >> 4) + bVar50 & 0xf);
    auVar22[4] = ((char)(ushort)((uint6)uVar60 >> 0x24) + cVar72 & 0xfU) +
                 ((char)(ushort)((uint6)uVar31 >> 0x24) + cVar51 & 0xfU);
    auVar22[5] = ((bVar73 >> 4) + bVar73 & 0xf) + ((bVar52 >> 4) + bVar52 & 0xf);
    auVar22[6] = ((char)(ushort)((ulong)uVar61 >> 0x34) + cVar74 & 0xfU) +
                 ((char)(ushort)((ulong)uVar32 >> 0x34) + cVar53 & 0xfU);
    auVar22[7] = ((bVar75 >> 4) + bVar75 & 0xf) + ((bVar54 >> 4) + bVar54 & 0xf);
    auVar22[8] = ((char)(ushort)((unkuint10)auVar63._0_10_ >> 0x44) + cVar76 & 0xfU) +
                 ((char)(ushort)((unkuint10)auVar36._0_10_ >> 0x44) + cVar55 & 0xfU);
    auVar22[9] = ((bVar77 >> 4) + bVar77 & 0xf) + ((bVar56 >> 4) + bVar56 & 0xf);
    auVar22[10] = ((char)(auVar63._10_2_ >> 4) + auVar63[10] & 0xfU) +
                  ((char)(auVar36._10_2_ >> 4) + auVar36[10] & 0xfU);
    auVar22[0xb] = ((auVar63[0xb] >> 4) + auVar63[0xb] & 0xf) +
                   ((auVar36[0xb] >> 4) + auVar36[0xb] & 0xf);
    auVar22[0xc] = ((char)(auVar65._12_2_ >> 4) + auVar65[0xc] & 0xfU) +
                   ((char)(auVar40._12_2_ >> 4) + auVar40[0xc] & 0xfU);
    auVar22[0xd] = ((auVar65[0xd] >> 4) + auVar65[0xd] & 0xf) +
                   ((auVar40[0xd] >> 4) + auVar40[0xd] & 0xf);
    auVar22[0xe] = ((char)(auVar68._14_2_ >> 4) + auVar68[0xe] & 0xfU) +
                   ((char)(auVar47._14_2_ >> 4) + auVar47[0xe] & 0xfU);
    auVar22[0xf] = ((auVar68[0xf] >> 4) + auVar68[0xf] & 0xf) +
                   ((auVar47[0xf] >> 4) + auVar47[0xf] & 0xf);
    auVar20 = psadbw(auVar22,(undefined1  [16])0x0);
    uVar15 = ~uVar11 & uVar13;
    uVar13 = uVar13 & uVar11;
    uVar11 = ~uVar12 & uVar14;
    uVar14 = uVar14 & uVar12;
    auVar93._0_2_ = (ushort)uVar15 >> 1;
    auVar93._2_2_ = (ushort)(uVar15 >> 0x10) >> 1;
    auVar93._4_2_ = (ushort)(uVar15 >> 0x20) >> 1;
    auVar93._6_2_ = (ushort)(uVar15 >> 0x31);
    auVar93._8_2_ = (ushort)uVar13 >> 1;
    auVar93._10_2_ = (ushort)(uVar13 >> 0x10) >> 1;
    auVar93._12_2_ = (ushort)(uVar13 >> 0x20) >> 1;
    auVar93._14_2_ = (ushort)(uVar13 >> 0x31);
    auVar93 = auVar93 & _DAT_001150b0;
    uVar29 = CONCAT11((char)(uVar15 >> 8) - auVar93[1],(char)uVar15 - auVar93[0]);
    uVar30 = CONCAT13((char)(uVar15 >> 0x18) - auVar93[3],
                      CONCAT12((char)(uVar15 >> 0x10) - auVar93[2],uVar29));
    uVar31 = CONCAT15((char)(uVar15 >> 0x28) - auVar93[5],
                      CONCAT14((char)(uVar15 >> 0x20) - auVar93[4],uVar30));
    uVar32 = CONCAT17((char)(uVar15 >> 0x38) - auVar93[7],
                      CONCAT16((char)(uVar15 >> 0x30) - auVar93[6],uVar31));
    auVar94._0_10_ =
         CONCAT19((char)(uVar13 >> 8) - auVar93[9],CONCAT18((char)uVar13 - auVar93[8],uVar32));
    auVar94[10] = (char)(uVar13 >> 0x10) - auVar93[10];
    auVar94[0xb] = (char)(uVar13 >> 0x18) - auVar93[0xb];
    auVar96[0xc] = (char)(uVar13 >> 0x20) - auVar93[0xc];
    auVar96._0_12_ = auVar94;
    auVar96[0xd] = (char)(uVar13 >> 0x28) - auVar93[0xd];
    auVar98[0xe] = (char)(uVar13 >> 0x30) - auVar93[0xe];
    auVar98._0_14_ = auVar96;
    auVar98[0xf] = (char)(uVar13 >> 0x38) - auVar93[0xf];
    auVar25 = auVar98 & _DAT_001150c0;
    auVar99._0_2_ = uVar29 >> 2;
    auVar99._2_2_ = (ushort)((uint)uVar30 >> 0x12);
    auVar99._4_2_ = (ushort)((uint6)uVar31 >> 0x22);
    auVar99._6_2_ = (ushort)((ulong)uVar32 >> 0x32);
    auVar99._8_2_ = (ushort)((unkuint10)auVar94._0_10_ >> 0x42);
    auVar99._10_2_ = auVar94._10_2_ >> 2;
    auVar99._12_2_ = auVar96._12_2_ >> 2;
    auVar99._14_2_ = auVar98._14_2_ >> 2;
    auVar99 = auVar99 & _DAT_001150c0;
    cVar57 = auVar99[0] + auVar25[0];
    bVar69 = auVar99[1] + auVar25[1];
    uVar58 = CONCAT11(bVar69,cVar57);
    cVar70 = auVar99[2] + auVar25[2];
    bVar71 = auVar99[3] + auVar25[3];
    uVar59 = CONCAT13(bVar71,CONCAT12(cVar70,uVar58));
    cVar72 = auVar99[4] + auVar25[4];
    bVar73 = auVar99[5] + auVar25[5];
    uVar60 = CONCAT15(bVar73,CONCAT14(cVar72,uVar59));
    cVar74 = auVar99[6] + auVar25[6];
    bVar75 = auVar99[7] + auVar25[7];
    uVar61 = CONCAT17(bVar75,CONCAT16(cVar74,uVar60));
    cVar76 = auVar99[8] + auVar25[8];
    bVar77 = auVar99[9] + auVar25[9];
    auVar95._0_10_ = CONCAT19(bVar77,CONCAT18(cVar76,uVar61));
    auVar95[10] = auVar99[10] + auVar25[10];
    auVar95[0xb] = auVar99[0xb] + auVar25[0xb];
    auVar97[0xc] = auVar99[0xc] + auVar25[0xc];
    auVar97._0_12_ = auVar95;
    auVar97[0xd] = auVar99[0xd] + auVar25[0xd];
    auVar100[0xe] = auVar99[0xe] + auVar25[0xe];
    auVar100._0_14_ = auVar97;
    auVar100[0xf] = auVar99[0xf] + auVar25[0xf];
    auVar101._0_2_ = (ushort)uVar11 >> 1;
    auVar101._2_2_ = (ushort)(uVar11 >> 0x10) >> 1;
    auVar101._4_2_ = (ushort)(uVar11 >> 0x20) >> 1;
    auVar101._6_2_ = (ushort)(uVar11 >> 0x31);
    auVar101._8_2_ = (ushort)uVar14 >> 1;
    auVar101._10_2_ = (ushort)(uVar14 >> 0x10) >> 1;
    auVar101._12_2_ = (ushort)(uVar14 >> 0x20) >> 1;
    auVar101._14_2_ = (ushort)(uVar14 >> 0x31);
    auVar101 = auVar101 & _DAT_001150b0;
    uVar29 = CONCAT11((char)(uVar11 >> 8) - auVar101[1],(char)uVar11 - auVar101[0]);
    uVar30 = CONCAT13((char)(uVar11 >> 0x18) - auVar101[3],
                      CONCAT12((char)(uVar11 >> 0x10) - auVar101[2],uVar29));
    uVar31 = CONCAT15((char)(uVar11 >> 0x28) - auVar101[5],
                      CONCAT14((char)(uVar11 >> 0x20) - auVar101[4],uVar30));
    uVar32 = CONCAT17((char)(uVar11 >> 0x38) - auVar101[7],
                      CONCAT16((char)(uVar11 >> 0x30) - auVar101[6],uVar31));
    auVar78._0_10_ =
         CONCAT19((char)(uVar14 >> 8) - auVar101[9],CONCAT18((char)uVar14 - auVar101[8],uVar32));
    auVar78[10] = (char)(uVar14 >> 0x10) - auVar101[10];
    auVar78[0xb] = (char)(uVar14 >> 0x18) - auVar101[0xb];
    auVar80[0xc] = (char)(uVar14 >> 0x20) - auVar101[0xc];
    auVar80._0_12_ = auVar78;
    auVar80[0xd] = (char)(uVar14 >> 0x28) - auVar101[0xd];
    auVar82[0xe] = (char)(uVar14 >> 0x30) - auVar101[0xe];
    auVar82._0_14_ = auVar80;
    auVar82[0xf] = (char)(uVar14 >> 0x38) - auVar101[0xf];
    auVar25 = auVar82 & _DAT_001150c0;
    auVar83._0_2_ = uVar29 >> 2;
    auVar83._2_2_ = (ushort)((uint)uVar30 >> 0x12);
    auVar83._4_2_ = (ushort)((uint6)uVar31 >> 0x22);
    auVar83._6_2_ = (ushort)((ulong)uVar32 >> 0x32);
    auVar83._8_2_ = (ushort)((unkuint10)auVar78._0_10_ >> 0x42);
    auVar83._10_2_ = auVar78._10_2_ >> 2;
    auVar83._12_2_ = auVar80._12_2_ >> 2;
    auVar83._14_2_ = auVar82._14_2_ >> 2;
    auVar83 = auVar83 & _DAT_001150c0;
    cVar28 = auVar83[0] + auVar25[0];
    bVar48 = auVar83[1] + auVar25[1];
    uVar29 = CONCAT11(bVar48,cVar28);
    cVar49 = auVar83[2] + auVar25[2];
    bVar50 = auVar83[3] + auVar25[3];
    uVar30 = CONCAT13(bVar50,CONCAT12(cVar49,uVar29));
    cVar51 = auVar83[4] + auVar25[4];
    bVar52 = auVar83[5] + auVar25[5];
    uVar31 = CONCAT15(bVar52,CONCAT14(cVar51,uVar30));
    cVar53 = auVar83[6] + auVar25[6];
    bVar54 = auVar83[7] + auVar25[7];
    uVar32 = CONCAT17(bVar54,CONCAT16(cVar53,uVar31));
    cVar55 = auVar83[8] + auVar25[8];
    bVar56 = auVar83[9] + auVar25[9];
    auVar79._0_10_ = CONCAT19(bVar56,CONCAT18(cVar55,uVar32));
    auVar79[10] = auVar83[10] + auVar25[10];
    auVar79[0xb] = auVar83[0xb] + auVar25[0xb];
    auVar81[0xc] = auVar83[0xc] + auVar25[0xc];
    auVar81._0_12_ = auVar79;
    auVar81[0xd] = auVar83[0xd] + auVar25[0xd];
    auVar84[0xe] = auVar83[0xe] + auVar25[0xe];
    auVar84._0_14_ = auVar81;
    auVar84[0xf] = auVar83[0xf] + auVar25[0xf];
    auVar27[0] = ((char)(uVar29 >> 4) + cVar28 & 0xfU) + ((char)(uVar58 >> 4) + cVar57 & 0xfU);
    auVar27[1] = ((bVar48 >> 4) + bVar48 & 0xf) + ((bVar69 >> 4) + bVar69 & 0xf);
    auVar27[2] = ((char)(ushort)((uint)uVar30 >> 0x14) + cVar49 & 0xfU) +
                 ((char)(ushort)((uint)uVar59 >> 0x14) + cVar70 & 0xfU);
    auVar27[3] = ((bVar50 >> 4) + bVar50 & 0xf) + ((bVar71 >> 4) + bVar71 & 0xf);
    auVar27[4] = ((char)(ushort)((uint6)uVar31 >> 0x24) + cVar51 & 0xfU) +
                 ((char)(ushort)((uint6)uVar60 >> 0x24) + cVar72 & 0xfU);
    auVar27[5] = ((bVar52 >> 4) + bVar52 & 0xf) + ((bVar73 >> 4) + bVar73 & 0xf);
    auVar27[6] = ((char)(ushort)((ulong)uVar32 >> 0x34) + cVar53 & 0xfU) +
                 ((char)(ushort)((ulong)uVar61 >> 0x34) + cVar74 & 0xfU);
    auVar27[7] = ((bVar54 >> 4) + bVar54 & 0xf) + ((bVar75 >> 4) + bVar75 & 0xf);
    auVar27[8] = ((char)(ushort)((unkuint10)auVar79._0_10_ >> 0x44) + cVar55 & 0xfU) +
                 ((char)(ushort)((unkuint10)auVar95._0_10_ >> 0x44) + cVar76 & 0xfU);
    auVar27[9] = ((bVar56 >> 4) + bVar56 & 0xf) + ((bVar77 >> 4) + bVar77 & 0xf);
    auVar27[10] = ((char)(auVar79._10_2_ >> 4) + auVar79[10] & 0xfU) +
                  ((char)(auVar95._10_2_ >> 4) + auVar95[10] & 0xfU);
    auVar27[0xb] = ((auVar79[0xb] >> 4) + auVar79[0xb] & 0xf) +
                   ((auVar95[0xb] >> 4) + auVar95[0xb] & 0xf);
    auVar27[0xc] = ((char)(auVar81._12_2_ >> 4) + auVar81[0xc] & 0xfU) +
                   ((char)(auVar97._12_2_ >> 4) + auVar97[0xc] & 0xfU);
    auVar27[0xd] = ((auVar81[0xd] >> 4) + auVar81[0xd] & 0xf) +
                   ((auVar97[0xd] >> 4) + auVar97[0xd] & 0xf);
    auVar27[0xe] = ((char)(auVar84._14_2_ >> 4) + auVar84[0xe] & 0xfU) +
                   ((char)(auVar100._14_2_ >> 4) + auVar100[0xe] & 0xfU);
    auVar27[0xf] = ((auVar84[0xf] >> 4) + auVar84[0xf] & 0xf) +
                   ((auVar100[0xf] >> 4) + auVar100[0xf] & 0xf);
    auVar25 = psadbw(auVar27,(undefined1  [16])0x0);
  }
  __return_storage_ptr__->A = ppVar1->A + (uVar3 & 0xffffffff) + auVar20._0_8_;
  __return_storage_ptr__->C = uVar7 + (uVar3 >> 0x20) + auVar20._8_8_;
  __return_storage_ptr__->G = uVar8 + (uVar4 & 0xffffffff) + auVar25._0_8_;
  __return_storage_ptr__->T = uVar9 + (uVar4 >> 0x20) + auVar25._8_8_;
  return __return_storage_ptr__;
}

Assistant:

p_rank parallel_rank(uint64_t i){

		uint64_t superblock_number = i / SUPERBLOCK_SIZE;
		uint64_t superblock_off = i % SUPERBLOCK_SIZE;
		uint64_t block_number = superblock_off / BLOCK_SIZE;
		uint64_t block_off = superblock_off % BLOCK_SIZE;

		p_rank superblock_r = superblock_ranks[superblock_number];
		p_rank block_r = get_counters(superblock_number,block_number);

		return superblock_r + block_r + block_rank(superblock_number, block_number, block_off);

	}